

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O1

int run_test_semaphore_2(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  long *plVar3;
  uv_connect_t *puVar4;
  uv_shutdown_t *puVar5;
  int64_t eval_b;
  uv_thread_t thread;
  int64_t eval_b_2;
  worker_config_conflict1 wc;
  void *pvStack_2d0;
  uv_shutdown_t auStack_2c8 [2];
  code *pcStack_1d8;
  code *pcStack_1c8;
  code *pcStack_1c0;
  uv_connect_t auStack_1b0 [2];
  code *pcStack_b8;
  long lStack_b0;
  long lStack_a8;
  long alStack_a0 [4];
  code *pcStack_80;
  long local_70;
  long local_68 [12];
  
  plVar3 = local_68 + 7;
  local_68[10] = 0;
  local_68[8] = 0;
  local_68[9] = 0;
  local_68[6] = 0;
  local_68[7] = 0;
  local_68[4] = 0;
  local_68[5] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0xb] = 100;
  pcStack_80 = (code *)0x1ba64d;
  iVar1 = uv_sem_init(plVar3,0);
  local_68[0] = (long)iVar1;
  local_70 = 0;
  if (local_68[0] == 0) {
    pcStack_80 = (code *)0x1ba677;
    iVar1 = uv_mutex_init(local_68 + 2);
    local_68[0] = (long)iVar1;
    local_70 = 0;
    if (local_68[0] != 0) goto LAB_001ba720;
    pcStack_80 = (code *)0x1ba6ad;
    iVar1 = uv_thread_create(local_68,worker,local_68 + 2);
    local_70 = (long)iVar1;
    local_68[1] = 0;
    if (local_70 != 0) goto LAB_001ba72f;
    pcStack_80 = (code *)0x1ba6d1;
    uv_sem_wait(plVar3);
    pcStack_80 = (code *)0x1ba6db;
    iVar1 = uv_thread_join(local_68);
    local_70 = (long)iVar1;
    local_68[1] = 0;
    if (local_70 == 0) {
      pcStack_80 = (code *)0x1ba701;
      uv_mutex_destroy(local_68 + 2);
      pcStack_80 = (code *)0x1ba709;
      uv_sem_destroy(plVar3);
      return 0;
    }
  }
  else {
    pcStack_80 = (code *)0x1ba720;
    run_test_semaphore_2_cold_1();
LAB_001ba720:
    pcStack_80 = (code *)0x1ba72f;
    run_test_semaphore_2_cold_2();
LAB_001ba72f:
    pcStack_80 = (code *)0x1ba73e;
    run_test_semaphore_2_cold_3();
  }
  pcStack_80 = run_test_semaphore_3;
  run_test_semaphore_2_cold_4();
  pcStack_b8 = (code *)0x1ba761;
  pcStack_80 = (code *)plVar3;
  iVar1 = uv_sem_init(alStack_a0,3);
  lStack_a8 = (long)iVar1;
  lStack_b0 = 0;
  if (lStack_a8 == 0) {
    plVar3 = alStack_a0;
    pcStack_b8 = (code *)0x1ba78c;
    uv_sem_wait(plVar3);
    pcStack_b8 = (code *)0x1ba794;
    uv_sem_wait(plVar3);
    pcStack_b8 = (code *)0x1ba79c;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_a8 = (long)iVar1;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001ba850;
    lStack_a8 = -0xb;
    pcStack_b8 = (code *)0x1ba7cd;
    iVar1 = uv_sem_trywait(alStack_a0);
    lStack_b0 = (long)iVar1;
    if (lStack_a8 != lStack_b0) goto LAB_001ba85d;
    plVar3 = alStack_a0;
    pcStack_b8 = (code *)0x1ba7eb;
    uv_sem_post(plVar3);
    pcStack_b8 = (code *)0x1ba7f3;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_a8 = (long)iVar1;
    lStack_b0 = 0;
    if (lStack_a8 != 0) goto LAB_001ba86a;
    lStack_a8 = -0xb;
    pcStack_b8 = (code *)0x1ba820;
    iVar1 = uv_sem_trywait(alStack_a0);
    lStack_b0 = (long)iVar1;
    if (lStack_a8 == lStack_b0) {
      pcStack_b8 = (code *)0x1ba83b;
      uv_sem_destroy(alStack_a0);
      return 0;
    }
  }
  else {
    pcStack_b8 = (code *)0x1ba850;
    run_test_semaphore_3_cold_1();
LAB_001ba850:
    pcStack_b8 = (code *)0x1ba85d;
    run_test_semaphore_3_cold_2();
LAB_001ba85d:
    pcStack_b8 = (code *)0x1ba86a;
    run_test_semaphore_3_cold_3();
LAB_001ba86a:
    pcStack_b8 = (code *)0x1ba877;
    run_test_semaphore_3_cold_4();
  }
  pcStack_b8 = run_test_shutdown_close_tcp;
  run_test_semaphore_3_cold_5();
  pcStack_1c0 = (code *)0x1ba8a2;
  pcStack_b8 = (code *)plVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&auStack_1b0[0].type);
  auStack_1b0[0].reserved[1] = (void *)(long)iVar1;
  auStack_1b0[0].data = (uv_loop_t *)0x0;
  if (auStack_1b0[0].reserved[1] == (void *)0x0) {
    pcStack_1c0 = (code *)0x1ba8c7;
    uVar2 = uv_default_loop();
    pcStack_1c0 = (code *)0x1ba8d4;
    iVar1 = uv_tcp_init(uVar2,auStack_1b0[0].reserved + 1);
    auStack_1b0[0].data = (void *)(long)iVar1;
    auStack_1b0[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1b0[0].data != (uv_loop_t *)0x0) goto LAB_001baa3a;
    pcStack_1c0 = (code *)0x1ba911;
    iVar1 = uv_tcp_connect(&connect_req,auStack_1b0[0].reserved + 1,&auStack_1b0[0].type,connect_cb)
    ;
    auStack_1b0[0].data = (void *)(long)iVar1;
    auStack_1b0[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1b0[0].data != (uv_loop_t *)0x0) goto LAB_001baa49;
    pcStack_1c0 = (code *)0x1ba936;
    uVar2 = uv_default_loop();
    pcStack_1c0 = (code *)0x1ba940;
    iVar1 = uv_run(uVar2,0);
    auStack_1b0[0].data = (void *)(long)iVar1;
    auStack_1b0[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1b0[0].data != (uv_loop_t *)0x0) goto LAB_001baa58;
    auStack_1b0[0].data = (uv_loop_t *)0x1;
    auStack_1b0[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (auStack_1b0[0].loop != (uv_loop_t *)0x1) goto LAB_001baa67;
    auStack_1b0[0].data = (uv_loop_t *)0x1;
    auStack_1b0[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (auStack_1b0[0].loop != (uv_loop_t *)0x1) goto LAB_001baa76;
    auStack_1b0[0].data = (uv_loop_t *)0x1;
    auStack_1b0[0].loop = (uv_loop_t *)(long)close_cb_called;
    if (auStack_1b0[0].loop != (uv_loop_t *)0x1) goto LAB_001baa85;
    pcStack_1c0 = (code *)0x1ba9d4;
    plVar3 = (long *)uv_default_loop();
    pcStack_1c0 = (code *)0x1ba9e8;
    uv_walk(plVar3,close_walk_cb,0);
    pcStack_1c0 = (code *)0x1ba9f2;
    uv_run(plVar3,0);
    auStack_1b0[0].data = (uv_loop_t *)0x0;
    pcStack_1c0 = (code *)0x1baa00;
    uVar2 = uv_default_loop();
    pcStack_1c0 = (code *)0x1baa08;
    iVar1 = uv_loop_close(uVar2);
    auStack_1b0[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1b0[0].data == auStack_1b0[0].loop) {
      pcStack_1c0 = (code *)0x1baa20;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1c0 = (code *)0x1baa3a;
    run_test_shutdown_close_tcp_cold_1();
LAB_001baa3a:
    pcStack_1c0 = (code *)0x1baa49;
    run_test_shutdown_close_tcp_cold_2();
LAB_001baa49:
    pcStack_1c0 = (code *)0x1baa58;
    run_test_shutdown_close_tcp_cold_3();
LAB_001baa58:
    pcStack_1c0 = (code *)0x1baa67;
    run_test_shutdown_close_tcp_cold_4();
LAB_001baa67:
    pcStack_1c0 = (code *)0x1baa76;
    run_test_shutdown_close_tcp_cold_5();
LAB_001baa76:
    pcStack_1c0 = (code *)0x1baa85;
    run_test_shutdown_close_tcp_cold_6();
LAB_001baa85:
    pcStack_1c0 = (code *)0x1baa94;
    run_test_shutdown_close_tcp_cold_7();
  }
  puVar4 = auStack_1b0;
  iVar1 = (int)auStack_1b0 + 8;
  pcStack_1c0 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (puVar4 == &connect_req) {
    pcStack_1c0 = (code *)(long)iVar1;
    pcStack_1c8 = (code *)0x0;
    if (pcStack_1c0 != (code *)0x0) goto LAB_001bab85;
    pcStack_1d8 = (code *)0x1baaf2;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    pcStack_1c0 = (code *)(long)iVar1;
    pcStack_1c8 = (code *)0x0;
    if (pcStack_1c0 != (code *)0x0) goto LAB_001bab94;
    pcStack_1d8 = (code *)0x1bab1e;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_1c0 = (code *)(long)iVar1;
    pcStack_1c8 = (code *)0x0;
    if (pcStack_1c0 != (code *)0x0) goto LAB_001baba3;
    pcStack_1d8 = (code *)0x1bab4d;
    uv_close(connect_req.handle,close_cb);
    pcStack_1c0 = (code *)0x1;
    pcStack_1d8 = (code *)0x1bab62;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_1c8 = (code *)(long)iVar1;
    if (pcStack_1c0 == pcStack_1c8) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_1c0;
    }
  }
  else {
    pcStack_1d8 = (code *)0x1bab85;
    connect_cb_cold_1();
LAB_001bab85:
    pcStack_1d8 = (code *)0x1bab94;
    connect_cb_cold_2();
LAB_001bab94:
    pcStack_1d8 = (code *)0x1baba3;
    connect_cb_cold_3();
LAB_001baba3:
    pcStack_1d8 = (code *)0x1babb2;
    connect_cb_cold_4();
  }
  pcStack_1d8 = run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  pcStack_1d8 = (code *)plVar3;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&auStack_2c8[0].loop,0);
  auStack_2c8[0].data = (void *)(long)iVar1;
  pvStack_2d0 = (void *)0x0;
  if (auStack_2c8[0].data == (void *)0x0) {
    uv_pipe_connect(&connect_req,&auStack_2c8[0].loop,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_2c8[0].data = (void *)(long)iVar1;
    pvStack_2d0 = (void *)0x0;
    if (auStack_2c8[0].data != (void *)0x0) goto LAB_001bad25;
    auStack_2c8[0].data = (void *)0x1;
    pvStack_2d0 = (void *)(long)connect_cb_called;
    if (pvStack_2d0 != (void *)0x1) goto LAB_001bad34;
    auStack_2c8[0].data = (void *)0x1;
    pvStack_2d0 = (void *)(long)shutdown_cb_called;
    if (pvStack_2d0 != (void *)0x1) goto LAB_001bad43;
    auStack_2c8[0].data = (void *)0x1;
    pvStack_2d0 = (void *)(long)close_cb_called;
    if (pvStack_2d0 == (void *)0x1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      auStack_2c8[0].data = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      pvStack_2d0 = (void *)(long)iVar1;
      if (auStack_2c8[0].data == pvStack_2d0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001bad61;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001bad25:
    run_test_shutdown_close_pipe_cold_2();
LAB_001bad34:
    run_test_shutdown_close_pipe_cold_3();
LAB_001bad43:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001bad61:
  puVar5 = auStack_2c8;
  iVar1 = (int)&pvStack_2d0;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar5 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}